

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O2

bool RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *stack,size_t pos,vector<unsigned_int,_std::allocator<unsigned_int>_> *roots,
               bool fully_factorizable,int depth,Elem randv,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  _Vector_impl_data *this;
  value_type_conflict5 *__x;
  pointer puVar1;
  Elem a;
  uint uVar2;
  uint uVar3;
  long lVar4;
  pointer puVar5;
  undefined7 in_register_00000009;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar6;
  ulong uVar7;
  Elem b;
  Elem b_00;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *extraout_RDX;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *extraout_RDX_00;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar8;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *field_01;
  _Vector_impl_data *__x_00;
  _Vector_impl_data *p_Var9;
  int iVar10;
  size_t x;
  ulong uVar11;
  _Vector_impl_data *this_00;
  int iVar12;
  pointer pvVar13;
  long in_FS_OFFSET;
  bool bVar14;
  undefined4 in_stack_fffffffffffffd88;
  uint local_23c;
  Elem sol;
  long local_38;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *field_00;
  
  uVar2 = (uint)CONCAT71(in_register_00000009,fully_factorizable);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar13 = (stack->
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __x = pvVar13[pos].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start;
  lVar4 = (long)*(pointer *)
                 ((long)&pvVar13[pos].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8) - (long)__x >> 2;
  if (lVar4 == 3) {
    if (__x[1] != 0) {
      uVar2 = *__x;
      uVar3 = InvExtGCD<unsigned_int,BitsInt<unsigned_int,32>,32,141u>(__x[1]);
      uVar3 = RecLinTrans<unsigned_int,6,6,5,5,5,5>::Map<BitsInt<unsigned_int,32>,0>
                        ((RecLinTrans<unsigned_int,6,6,5,5,5,5> *)
                         (anonymous_namespace)::SQR_TABLE_32,uVar3);
      a = anon_unknown.dwarf_2eb8769::
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)(ulong)uVar2,uVar3,b);
      uVar2 = RecLinTrans<unsigned_int,6,6,5,5,5,5>::Map<BitsInt<unsigned_int,32>,0>
                        ((RecLinTrans<unsigned_int,6,6,5,5,5,5> *)
                         (anonymous_namespace)::QRT_TABLE_32,a);
      uVar3 = RecLinTrans<unsigned_int,6,6,5,5,5,5>::Map<BitsInt<unsigned_int,32>,0>
                        ((RecLinTrans<unsigned_int,6,6,5,5,5,5> *)
                         (anonymous_namespace)::SQR_TABLE_32,uVar2);
      if ((uVar3 ^ uVar2) == a) {
        sol = anon_unknown.dwarf_2eb8769::
              Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                     *)(ulong)uVar2,
                    *(Elem *)(*(long *)&pvVar13[pos].
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data + 4),b_00);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(roots,&sol);
        local_23c = *(uint *)(*(long *)&pvVar13[pos].
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data + 4) ^ sol;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (roots,&local_23c);
        goto LAB_008e6694;
      }
    }
  }
  else {
    if (lVar4 == 2) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(roots,__x);
LAB_008e6694:
      bVar14 = true;
      goto LAB_008e69a3;
    }
    if ((ulong)(((long)(stack->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar13) / 0x18) <
        pos + 3) {
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::resize(stack,(pos + 3) * 2);
      pvVar13 = (stack->
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    this = (_Vector_impl_data *)(pvVar13 + pos);
    __x_00 = (_Vector_impl_data *)(pvVar13 + pos + 1);
    puVar5 = pvVar13[pos + 2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar13[pos + 2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data + 8) != puVar5) {
      this[2]._M_finish = puVar5;
    }
    if (*(pointer *)
         ((long)&pvVar13[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data + 8) != __x_00->_M_start) {
      *(pointer *)
       ((long)&pvVar13[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data + 8) = __x_00->_M_start;
    }
    this_00 = (_Vector_impl_data *)(pvVar13 + pos + 2);
    puVar5 = this->_M_start;
    pFVar8 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              *)this->_M_finish;
    iVar10 = 0;
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                 (long)pFVar8 - (long)puVar5 >> 1);
      p_Var9 = (_Vector_impl_data *)0x2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,2);
      puVar5 = this_00->_M_start;
      *puVar5 = 0;
      puVar5[1] = randv;
      iVar12 = 0x1f;
      while (bVar14 = iVar12 != 0, iVar12 = iVar12 + -1, bVar14) {
        Sqr<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                   (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    *)p_Var9);
        puVar5 = this[2]._M_start;
        pFVar8 = extraout_RDX;
        if ((ulong)((long)this[2]._M_finish - (long)puVar5) < 5) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,2);
          puVar5 = this_00->_M_start;
          pFVar8 = extraout_RDX_00;
        }
        puVar5[1] = randv;
        p_Var9 = this_00;
        PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,pFVar8);
      }
      if (iVar10 == 0) {
        if ((uVar2 & 1) != 0) goto LAB_008e682a;
      }
      else {
        if ((uVar2 & 1) == 0) {
          p_Var9 = this_00;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x_00,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
          Sqr<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x_00,
                     (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                      *)p_Var9);
          puVar5 = this[2]._M_start;
          puVar1 = this[2]._M_finish;
          for (lVar4 = 0; (long)puVar1 - (long)puVar5 >> 2 != lVar4; lVar4 = lVar4 + 1) {
            __x_00->_M_start[lVar4] = __x_00->_M_start[lVar4] ^ puVar5[lVar4];
          }
          pFVar8 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    *)__x_00->_M_start;
          field_00 = *(Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                       **)((long)&pvVar13[pos + 1].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data + 8);
          while ((pFVar6 = field_00 + -4, field_00 != pFVar8 && (*(int *)pFVar6 == 0))) {
            *(Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
              **)((long)&pvVar13[pos + 1].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8) = pFVar6;
            field_00 = pFVar6;
          }
          PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x_00,field_00);
          uVar2 = (uint)CONCAT71((int7)((ulong)pFVar6 >> 8),1);
          if (*(pointer *)
               ((long)&pvVar13[pos + 1].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data + 8) != __x_00->_M_start) goto LAB_008e69a1;
        }
LAB_008e682a:
        if ((-0x20 < depth) &&
           (((long)this->_M_finish - (long)this->_M_start >> 2) - 2U >>
            (-((char)depth + ' ') & 0x3fU) != 0)) goto LAB_008e69a1;
      }
      depth = depth + 1;
      randv = (int)randv >> 0x1f & 0x8dU ^ randv * 2;
      p_Var9 = this;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x_00,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar13[pos + 1].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data + 8) - (long)__x_00->_M_start) <=
          (ulong)((long)this[2]._M_finish - (long)this[2]._M_start)) goto LAB_008e6896;
      while( true ) {
        p_Var9 = __x_00;
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::_Vector_impl_data::
        _M_swap_data(this_00,__x_00);
LAB_008e6896:
        lVar4 = (long)*(pointer *)
                       ((long)&pvVar13[pos + 1].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 8) - (long)__x_00->_M_start >> 2;
        if (lVar4 == 0) {
          puVar5 = this_00->_M_start;
          goto LAB_008e68c4;
        }
        if (lVar4 == 1) break;
        MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x_00,
                   (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                    *)p_Var9);
        PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x_00,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,field_01);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,1);
      puVar5 = this_00->_M_start;
      *puVar5 = 1;
LAB_008e68c4:
      uVar7 = (long)this[2]._M_finish - (long)puVar5;
      puVar5 = this->_M_start;
      pFVar8 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                *)this->_M_finish;
      iVar10 = iVar10 + 1;
    } while (uVar7 < 5 || uVar7 == (long)pFVar8 - (long)puVar5);
    MakeMonic<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,pFVar8);
    uVar11 = (long)this[2]._M_finish - (long)this[2]._M_start >> 2;
    uVar7 = (long)this->_M_finish - (long)this->_M_start >> 2;
    if (uVar7 < uVar11) {
      if (*(pointer *)
           ((long)&pvVar13[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data + 8) != __x_00->_M_start) {
        *(pointer *)
         ((long)&pvVar13[pos + 1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data + 8) = __x_00->_M_start;
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__x_00,(uVar7 - uVar11) + 1)
      ;
      while( true ) {
        puVar5 = this->_M_finish;
        uVar7 = (long)puVar5 - (long)this->_M_start >> 2;
        if (uVar7 < uVar11) break;
        uVar3 = puVar5[-1];
        __x_00->_M_start[uVar7 - uVar11] = uVar3;
        this->_M_finish = puVar5 + -1;
        if (uVar3 != 0) {
          RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::
          Build<&LFSR<BitsInt<unsigned_int,32>,141u>::Call>
                    ((RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *)&sol,uVar3);
          for (uVar7 = 0; uVar7 < ((long)this[2]._M_finish - (long)this[2]._M_start >> 2) - 1U;
              uVar7 = uVar7 + 1) {
            uVar3 = RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>::Map<BitsInt<unsigned_int,32>,0>
                              ((RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4> *)&sol,
                               this[2]._M_start[uVar7]);
            this->_M_finish[(uVar7 + 1) - uVar11] = this->_M_finish[(uVar7 + 1) - uVar11] ^ uVar3;
          }
        }
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::_Vector_impl_data::_M_swap_data
              (this,this_00);
    bVar14 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                       (stack,pos + 1,roots,(bool)((byte)uVar2 & 1),depth,randv,
                        (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                         *)CONCAT44(uVar2,in_stack_fffffffffffffd88));
    if (bVar14) {
      bVar14 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                         (stack,pos,roots,true,depth,randv,
                          (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                           *)CONCAT44(uVar2,in_stack_fffffffffffffd88));
      goto LAB_008e69a3;
    }
  }
LAB_008e69a1:
  bVar14 = false;
LAB_008e69a3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar14;
}

Assistant:

bool RecFindRoots(std::vector<std::vector<typename F::Elem>>& stack, size_t pos, std::vector<typename F::Elem>& roots, bool fully_factorizable, int depth, typename F::Elem randv, const F& field) {
    auto& ppoly = stack[pos];
    // We assert ppoly.size() > 1 (instead of just ppoly.size() > 0) to additionally exclude
    // constants polynomials because
    //  - ppoly is not constant initially (this is ensured by FindRoots()), and
    //  - we never recurse on a constant polynomial.
    CHECK_SAFE(ppoly.size() > 1 && ppoly.back() == 1);
    /* 1st degree input: constant term is the root. */
    if (ppoly.size() == 2) {
        roots.push_back(ppoly[0]);
        return true;
    }
    /* 2nd degree input: use direct quadratic solver. */
    if (ppoly.size() == 3) {
        CHECK_RETURN(ppoly[1] != 0, false); // Equations of the form (x^2 + a) have two identical solutions; contradicts square-free assumption. */
        auto input = field.Mul(ppoly[0], field.Sqr(field.Inv(ppoly[1])));
        auto root = field.Qrt(input);
        if ((field.Sqr(root) ^ root) != input) {
            CHECK_SAFE(!fully_factorizable);
            return false; // No root found.
        }
        auto sol = field.Mul(root, ppoly[1]);
        roots.push_back(sol);
        roots.push_back(sol ^ ppoly[1]);
        return true;
    }
    /* 3rd degree input and more: recurse further. */
    if (pos + 3 > stack.size()) {
        // Allocate memory if necessary.
        stack.resize((pos + 3) * 2);
    }
    auto& poly = stack[pos];
    auto& tmp = stack[pos + 1];
    auto& trace = stack[pos + 2];
    trace.clear();
    tmp.clear();
    for (int iter = 0;; ++iter) {
        // Compute the polynomial (trace(x*randv) mod poly(x)) symbolically,
        // and put the result in `trace`.
        TraceMod(poly, trace, randv, field);

        if (iter >= 1 && !fully_factorizable) {
            // If the polynomial cannot be factorized completely (it has an
            // irreducible factor of degree higher than 1), we want to avoid
            // the case where this is only detected after trying all BITS
            // independent split attempts fail (see the assert below).
            //
            // Observe that if we call y = randv*x, it is true that:
            //
            //   trace = y + y^2 + y^4 + y^8 + ... y^(FIELDSIZE/2) mod poly
            //
            // Due to the Frobenius endomorphism, this means:
            //
            //   trace^2 = y^2 + y^4 + y^8 + ... + y^FIELDSIZE mod poly
            //
            // Or, adding them up:
            //
            //   trace + trace^2 = y + y^FIELDSIZE mod poly.
            //                   = randv*x + randv^FIELDSIZE*x^FIELDSIZE
            //                   = randv*x + randv*x^FIELDSIZE
            //                   = randv*(x + x^FIELDSIZE).
            //     (all mod poly)
            //
            // x + x^FIELDSIZE is the polynomial which has every field element
            // as root once. Whenever x + x^FIELDSIZE is multiple of poly,
            // this means it only has unique first degree factors. The same
            // holds for its constant multiple randv*(x + x^FIELDSIZE) =
            // trace + trace^2.
            //
            // We use this test to quickly verify whether the polynomial is
            // fully factorizable after already having computed a trace.
            // We don't invoke it immediately; only when splitting has failed
            // at least once, which avoids it for most polynomials that are
            // fully factorizable (or at least pushes the test down the
            // recursion to factors which are smaller and thus faster).
            tmp = trace;
            Sqr(tmp, field);
            for (size_t i = 0; i < trace.size(); ++i) {
                tmp[i] ^= trace[i];
            }
            while (tmp.size() && tmp.back() == 0) tmp.pop_back();
            PolyMod(poly, tmp, field);

            // Whenever the test fails, we can immediately abort the root
            // finding. Whenever it succeeds, we can remember and pass down
            // the information that it is in fact fully factorizable, avoiding
            // the need to run the test again.
            if (tmp.size() != 0) return false;
            fully_factorizable = true;
        }

        if (fully_factorizable) {
            // Every successful iteration of this algorithm splits the input
            // polynomial further into buckets, each corresponding to a subset
            // of 2^(BITS-depth) roots. If after depth splits the degree of
            // the polynomial is >= 2^(BITS-depth), something is wrong.
            CHECK_RETURN(field.Bits() - depth >= std::numeric_limits<decltype(poly.size())>::digits ||
                (poly.size() - 2) >> (field.Bits() - depth) == 0, false);
        }

        depth++;
        // In every iteration we multiply randv by 2. As a result, the set
        // of randv values forms a GF(2)-linearly independent basis of splits.
        randv = field.Mul2(randv);
        tmp = poly;
        GCD(trace, tmp, field);
        if (trace.size() != poly.size() && trace.size() > 1) break;
    }
    MakeMonic(trace, field);
    DivMod(trace, poly, tmp, field);
    // At this point, the stack looks like [... (poly) tmp trace], and we want to recursively
    // find roots of trace and tmp (= poly/trace). As we don't care about poly anymore, move
    // trace into its position first.
    std::swap(poly, trace);
    // Now the stack is [... (trace) tmp ...]. First we factor tmp (at pos = pos+1), and then
    // we factor trace (at pos = pos).
    if (!RecFindRoots(stack, pos + 1, roots, fully_factorizable, depth, randv, field)) return false;
    // The stack position pos contains trace, the polynomial with all of poly's roots which (after
    // multiplication with randv) have trace 0. This is never the case for irreducible factors
    // (which always end up in tmp), so we can set fully_factorizable to true when recursing.
    bool ret = RecFindRoots(stack, pos, roots, true, depth, randv, field);
    // Because of the above, recursion can never fail here.
    CHECK_SAFE(ret);
    return ret;
}